

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

u8 * dec_bs_get_one_unit(com_bs_t *bs,u8 **next_start)

{
  uint uVar1;
  u8 *puVar2;
  u8 *puVar3;
  u8 *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  u8 *puVar9;
  
  puVar2 = bs->cur;
  puVar4 = bs->end + 1;
  uVar5 = (int)puVar4 - (int)puVar2;
  if (5 < (int)uVar5) {
    iVar6 = 0;
    do {
      uVar1 = *(uint *)(puVar2 + (long)iVar6 + 4);
      iVar7 = iVar6;
      if ((~(0x1000100 - uVar1 | uVar1) & 0x80008080) != 0) {
        uVar8 = (ulong)(iVar6 - (uint)((char)uVar1 == '\0'));
        if (iVar6 < 1) {
          uVar8 = (long)iVar6;
        }
        puVar3 = puVar2 + uVar8 + 4;
        iVar6 = (int)uVar8 + 2;
        do {
          iVar7 = iVar6;
          puVar9 = puVar3;
          iVar6 = iVar7 + 1;
          puVar3 = puVar9 + 1;
        } while (*puVar9 != '\0');
        if (((iVar6 < (int)(uVar5 - 4)) && (puVar9[1] == '\0')) && (puVar9[2] == '\x01')) {
          puVar4 = puVar2 + ((ulong)(uVar5 & 0x7fffffff) -
                            (long)(((int)bs->end - (int)puVar2) - iVar6));
          break;
        }
        iVar7 = iVar7 + -5;
      }
      iVar6 = iVar7 + 5;
    } while (iVar7 + 6 < (int)(uVar5 - 4));
  }
  *next_start = puVar4;
  puVar4 = dec_bs_demulate(puVar2 + -1,puVar4);
  return puVar4;
}

Assistant:

u8* dec_bs_get_one_unit(com_bs_t *bs, u8 **next_start)
{
    u8 *start = bs->cur;
    u8 *end   = bs->end + 1;
    int len = (int)(end - start);
    int left_bytes;

    if (dec_bs_find_start_code(start + 4, len - 4, &left_bytes)) {
        end = start + len - left_bytes;
    }

    *next_start = end;

    return dec_bs_demulate(start - 1, end);
}